

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall cmGeneratorTarget::ConstructSourceFileFlags(cmGeneratorTarget *this)

{
  cmSourceFile *pcVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  mapped_type *pmVar5;
  pointer pbVar6;
  cmSourceFile *sf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  relFiles;
  undefined1 local_68 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (this->SourceFileFlagsConstructed == false) {
    this->SourceFileFlagsConstructed = true;
    pcVar1 = (cmSourceFile *)(local_68 + 0x10);
    local_68._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"PUBLIC_HEADER","");
    pcVar3 = cmTarget::GetProperty(this->Target,(string *)local_68);
    if ((cmSourceFile *)local_68._0_8_ != pcVar1) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    if (pcVar3 != (char *)0x0) {
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68._0_8_ = pcVar1;
      sVar4 = strlen(pcVar3);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,pcVar3,pcVar3 + sVar4);
      cmSystemTools::ExpandListArgument((string *)local_68,&local_48,false);
      if ((cmSourceFile *)local_68._0_8_ != pcVar1) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      if (local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar6 = local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_68._0_8_ = cmMakefile::GetSource(this->Makefile,pbVar6);
          if ((cmSourceFile *)local_68._0_8_ != (cmSourceFile *)0x0) {
            pmVar5 = std::
                     map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                     ::operator[](&this->SourceFlagsMap,(key_type *)local_68);
            pmVar5->MacFolder = "Headers";
            pmVar5->Type = SourceFileTypePublicHeader;
          }
          pbVar6 = pbVar6 + 1;
        } while (pbVar6 != local_48.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
    }
    local_68._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"PRIVATE_HEADER","");
    pcVar3 = cmTarget::GetProperty(this->Target,(string *)local_68);
    if ((cmSourceFile *)local_68._0_8_ != pcVar1) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    if (pcVar3 != (char *)0x0) {
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68._0_8_ = pcVar1;
      sVar4 = strlen(pcVar3);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,pcVar3,pcVar3 + sVar4);
      cmSystemTools::ExpandListArgument((string *)local_68,&local_48,false);
      if ((cmSourceFile *)local_68._0_8_ != pcVar1) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      if (local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar6 = local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_68._0_8_ = cmMakefile::GetSource(this->Makefile,pbVar6);
          if ((cmSourceFile *)local_68._0_8_ != (cmSourceFile *)0x0) {
            pmVar5 = std::
                     map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                     ::operator[](&this->SourceFlagsMap,(key_type *)local_68);
            pmVar5->MacFolder = "PrivateHeaders";
            pmVar5->Type = SourceFileTypePrivateHeader;
          }
          pbVar6 = pbVar6 + 1;
        } while (pbVar6 != local_48.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
    }
    local_68._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"RESOURCE","");
    pcVar3 = cmTarget::GetProperty(this->Target,(string *)local_68);
    if ((cmSourceFile *)local_68._0_8_ != pcVar1) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    if (pcVar3 != (char *)0x0) {
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68._0_8_ = pcVar1;
      sVar4 = strlen(pcVar3);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,pcVar3,pcVar3 + sVar4);
      cmSystemTools::ExpandListArgument((string *)local_68,&local_48,false);
      if ((cmSourceFile *)local_68._0_8_ != pcVar1) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      if (local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar6 = local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_68._0_8_ = cmMakefile::GetSource(this->Makefile,pbVar6);
          if ((cmSourceFile *)local_68._0_8_ != (cmSourceFile *)0x0) {
            pmVar5 = std::
                     map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                     ::operator[](&this->SourceFlagsMap,(key_type *)local_68);
            pmVar5->MacFolder = "";
            bVar2 = cmMakefile::PlatformIsAppleIos(this->Makefile);
            if (!bVar2) {
              pmVar5->MacFolder = "Resources";
            }
            pmVar5->Type = SourceFileTypeResource;
          }
          pbVar6 = pbVar6 + 1;
        } while (pbVar6 != local_48.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
    }
  }
  return;
}

Assistant:

void cmGeneratorTarget::ConstructSourceFileFlags() const
{
  if(this->SourceFileFlagsConstructed)
    {
    return;
    }
  this->SourceFileFlagsConstructed = true;

  // Process public headers to mark the source files.
  if(const char* files = this->GetProperty("PUBLIC_HEADER"))
    {
    std::vector<std::string> relFiles;
    cmSystemTools::ExpandListArgument(files, relFiles);
    for(std::vector<std::string>::iterator it = relFiles.begin();
        it != relFiles.end(); ++it)
      {
      if(cmSourceFile* sf = this->Makefile->GetSource(*it))
        {
        SourceFileFlags& flags = this->SourceFlagsMap[sf];
        flags.MacFolder = "Headers";
        flags.Type = cmGeneratorTarget::SourceFileTypePublicHeader;
        }
      }
    }

  // Process private headers after public headers so that they take
  // precedence if a file is listed in both.
  if(const char* files = this->GetProperty("PRIVATE_HEADER"))
    {
    std::vector<std::string> relFiles;
    cmSystemTools::ExpandListArgument(files, relFiles);
    for(std::vector<std::string>::iterator it = relFiles.begin();
        it != relFiles.end(); ++it)
      {
      if(cmSourceFile* sf = this->Makefile->GetSource(*it))
        {
        SourceFileFlags& flags = this->SourceFlagsMap[sf];
        flags.MacFolder = "PrivateHeaders";
        flags.Type = cmGeneratorTarget::SourceFileTypePrivateHeader;
        }
      }
    }

  // Mark sources listed as resources.
  if(const char* files = this->GetProperty("RESOURCE"))
    {
    std::vector<std::string> relFiles;
    cmSystemTools::ExpandListArgument(files, relFiles);
    for(std::vector<std::string>::iterator it = relFiles.begin();
        it != relFiles.end(); ++it)
      {
      if(cmSourceFile* sf = this->Makefile->GetSource(*it))
        {
        SourceFileFlags& flags = this->SourceFlagsMap[sf];
        flags.MacFolder = "";
        if(!this->Makefile->PlatformIsAppleIos())
          {
          flags.MacFolder = "Resources";
          }
        flags.Type = cmGeneratorTarget::SourceFileTypeResource;
        }
      }
    }
}